

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virgo.h
# Opt level: O1

void __thiscall virgo::Chessboard::Chessboard(Chessboard *this)

{
  pair<virgo::Piece,_virgo::Player> *__s;
  byte bVar1;
  int i;
  ulong uVar2;
  pair<virgo::Piece,_virgo::Player> pVar3;
  int s;
  long lVar4;
  
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history).super__Vector_base<virgo::HistoryMove,_std::allocator<virgo::HistoryMove>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = this->squares;
  lVar4 = 0;
  memset(__s,0,0x200);
  this->castling_perm = '\0';
  this->fifty_mv_counter = '\0';
  this->next = WHITE;
  this->enpassant = 0x40;
  this->king_position[0] = 0x3c;
  this->king_position[1] = 4;
  this->all = 0xffff00000000ffff;
  this->pieces[0][0] = 0xff000000000000;
  this->pieces[0][1] = 0x8100000000000000;
  this->pieces[0][2] = 0x4200000000000000;
  this->pieces[0][3] = 0x2400000000000000;
  this->pieces[0][4] = 0x800000000000000;
  this->pieces[0][5] = 0x1000000000000000;
  this->pieces[1][0] = 0xff00;
  this->pieces[1][1] = 0x81;
  this->pieces[1][2] = 0x42;
  this->pieces[1][3] = 0x24;
  this->pieces[1][4] = 8;
  this->pieces[1][5] = 0x10;
  do {
    this->squares[lVar4].first = EMPTY;
    this->squares[lVar4].second = BLACK;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  lVar4 = 0;
  do {
    for (uVar2 = this->pieces[0][lVar4]; uVar2 != 0; uVar2 = uVar2 & uVar2 - 1) {
      bVar1 = (&(anonymous_namespace)::DEBRUIJN_INDICES)
              [(uVar2 - 1 ^ uVar2) * 0x3f79d71b4cb0a89 >> 0x3a];
      __s[bVar1].first = (Piece)lVar4;
      this->squares[bVar1].second = BLACK;
    }
    for (pVar3 = this->squares[lVar4 + -6]; pVar3 != (pair<virgo::Piece,_virgo::Player>)0x0;
        pVar3 = (pair<virgo::Piece,_virgo::Player>)((ulong)pVar3 & (long)pVar3 - 1U)) {
      bVar1 = (&(anonymous_namespace)::DEBRUIJN_INDICES)
              [((long)pVar3 - 1U ^ (ulong)pVar3) * 0x3f79d71b4cb0a89 >> 0x3a];
      __s[bVar1].first = (Piece)lVar4;
      this->squares[bVar1].second = WHITE;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return;
}

Assistant:

Chessboard::Chessboard() {
        // Initial chessboard setup
        this->castling_perm = 0x00;
        this->fifty_mv_counter = 0;
        this->next = WHITE;
        this->enpassant = INVALID;
        this->king_position[0] = e8;
        this->king_position[1] = e1;

        // Set chess starting position
        this->all = 0xffff00000000ffff;

        // Set black pieces
        this->pieces[0][PAWN] = 0x00ff000000000000; // Pawns
        this->pieces[0][ROOK] = 0x8100000000000000; // Rooks
        this->pieces[0][KNIGHT] = 0x4200000000000000; // Knights
        this->pieces[0][BISHOP] = 0x2400000000000000; // Bishops
        this->pieces[0][KING] = 0x0800000000000000; // King
        this->pieces[0][QUEEN] = 0x1000000000000000; // Queen

        // Set white pieces
        this->pieces[1][PAWN] = 0x000000000000ff00; // Pawns
        this->pieces[1][ROOK] = 0x0000000000000081; // Rooks
        this->pieces[1][KNIGHT] = 0x0000000000000042; // Knights
        this->pieces[1][BISHOP] = 0x0000000000000024; // Bishops
        this->pieces[1][KING] = 0x0000000000000008; // King
        this->pieces[1][QUEEN] = 0x0000000000000010; // Queen

        // Fill with empty values
        for(int s = a1; s <= h8; s++) {
            this->squares[s] = std::make_pair(EMPTY, BLACK);
        }

        // Set every pair which has a piece on the corresponding square index
        for(int i = PAWN; i <= QUEEN; i++) {
            uint64_t board = this->pieces[BLACK][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), BLACK);
                board &= (board-1);
            }
            board = this->pieces[WHITE][i];
            while(board) {
                this->squares[bit::pop_lsb_index(board)] = std::make_pair(static_cast<Piece>(i), WHITE);
                board &= (board-1);
            }
        }
    }